

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall Memory::Recycler::DumpObjectGraph(Recycler *this,Param *param)

{
  CollectionState CVar1;
  CollectionState CVar2;
  byte local_7f1;
  byte local_7e1;
  bool local_7d1;
  undefined1 local_7d0 [8];
  AutoRestoreValue<bool> skipStackToggle;
  AutoSetupRecyclerForNonCollectingMark AutoSetupRecyclerForNonCollectingMark;
  undefined1 local_260 [8];
  RecyclerObjectGraphDumper objectGraphDumper;
  DebugCheckNoException __debugCheckNoException;
  bool isExited;
  bool succeeded;
  Param *param_local;
  Recycler *this_local;
  
  CVar1 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&this->collectionState);
  if (CVar1 == CollectionStateExit) {
    SetCollectionState(this,CollectionStateNotCollecting);
  }
  CVar2 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&this->collectionState);
  if (CVar2 == CollectionStateNotCollecting) {
    DebugCheckNoException::DebugCheckNoException
              ((DebugCheckNoException *)&objectGraphDumper.field_0x22c);
    RecyclerObjectGraphDumper::RecyclerObjectGraphDumper
              ((RecyclerObjectGraphDumper *)local_260,this,param);
    Recycler::AutoSetupRecyclerForNonCollectingMark::AutoSetupRecyclerForNonCollectingMark
              ((AutoSetupRecyclerForNonCollectingMark *)&skipStackToggle.oldValue,this,false);
    local_7e1 = 1;
    if ((this->skipStack & 1U) == 0) {
      local_7f1 = 0;
      if (param != (Param *)0x0) {
        local_7f1 = param->skipStack;
      }
      local_7e1 = local_7f1;
    }
    local_7d1 = (bool)(local_7e1 & 1);
    AutoRestoreValue<bool>::AutoRestoreValue
              ((AutoRestoreValue<bool> *)local_7d0,&this->skipStack,&local_7d1);
    Mark(this);
    this->objectGraphDumper = (RecyclerObjectGraphDumper *)0x0;
    if (param != (Param *)0x0) {
      memcpy(&param->stats,&this->collectionStats,0x538);
    }
    this_local._7_1_ = (bool)((objectGraphDumper.dumpObjectTypeInfo._1_1_ ^ 0xff) & 1);
    AutoRestoreValue<bool>::~AutoRestoreValue((AutoRestoreValue<bool> *)local_7d0);
    Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark
              ((AutoSetupRecyclerForNonCollectingMark *)&skipStackToggle.oldValue);
    RecyclerObjectGraphDumper::~RecyclerObjectGraphDumper((RecyclerObjectGraphDumper *)local_260);
    DebugCheckNoException::~DebugCheckNoException
              ((DebugCheckNoException *)&objectGraphDumper.field_0x22c);
    if (CVar1 == CollectionStateExit) {
      SetCollectionState(this,CollectionStateExit);
    }
    if (this_local._7_1_ == false) {
      Output::Print(L"Out of memory dumping object graph\n");
    }
    Output::Flush();
  }
  else {
    Output::Print(L"Can\'t dump object graph when collecting\n");
    Output::Flush();
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Recycler::DumpObjectGraph(RecyclerObjectGraphDumper::Param * param)
{
    bool succeeded = false;
    bool isExited = (this->collectionState == CollectionStateExit);
    if (isExited)
    {
        this->SetCollectionState(CollectionStateNotCollecting);
    }
    if (this->collectionState != CollectionStateNotCollecting)
    {
        Output::Print(_u("Can't dump object graph when collecting\n"));
        Output::Flush();
        return succeeded;
    }
    BEGIN_NO_EXCEPTION
    {
        RecyclerObjectGraphDumper objectGraphDumper(this, param);

        Recycler::AutoSetupRecyclerForNonCollectingMark AutoSetupRecyclerForNonCollectingMark(*this);
        AutoRestoreValue<bool> skipStackToggle(&this->skipStack, this->skipStack || (param && param->skipStack));

        this->Mark();

        this->objectGraphDumper = nullptr;
#ifdef RECYCLER_STATS
        if (param)
        {
            param->stats = this->collectionStats;
        }
#endif
        succeeded = !objectGraphDumper.isOutOfMemory;
    }